

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_add_elements_raw_output_at
              (wally_tx *tx,uint32_t index,uint64_t satoshi,uchar *script,size_t script_len,
              uchar *asset,size_t asset_len,uchar *value,size_t value_len,uchar *nonce,
              size_t nonce_len,uchar *surjectionproof,size_t surjectionproof_len,uchar *rangeproof,
              size_t rangeproof_len,uint32_t flags,_Bool is_elements)

{
  bool local_bd;
  undefined1 auStack_b8 [4];
  int ret;
  wally_tx_output output;
  _Bool is_elements_local;
  uchar *asset_local;
  size_t script_len_local;
  uchar *script_local;
  uint64_t satoshi_local;
  uint32_t index_local;
  wally_tx *tx_local;
  
  output.rangeproof_len._7_1_ = is_elements;
  output.script_len._0_1_ = is_elements;
  output.asset = (uchar *)asset_len;
  output.asset_len = (size_t)value;
  output.value = (uchar *)value_len;
  output.value_len = (size_t)nonce;
  output.nonce = (uchar *)nonce_len;
  output.nonce_len = (size_t)surjectionproof;
  output.surjectionproof = (uchar *)surjectionproof_len;
  output.surjectionproof_len = (size_t)rangeproof;
  output.rangeproof = (uchar *)rangeproof_len;
  if (flags == 0) {
    if (((((asset != (uchar *)0x0) == (asset_len == 0x21)) &&
         (local_bd = value_len == 0x21 || value_len == 9, (value != (uchar *)0x0) == local_bd)) &&
        ((nonce != (uchar *)0x0) == (nonce_len == 0x21))) &&
       (((surjectionproof != (uchar *)0x0) == (surjectionproof_len != 0) &&
        ((rangeproof != (uchar *)0x0) == (rangeproof_len != 0))))) {
      _auStack_b8 = satoshi;
      output.satoshi = (uint64_t)script;
      output.script = (uchar *)script_len;
      output._24_8_ = asset;
      tx_local._4_4_ = wally_tx_add_output_at(tx,index,(wally_tx_output *)auStack_b8);
      wally_clear(auStack_b8,0x70);
    }
    else {
      tx_local._4_4_ = -2;
    }
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

static int tx_add_elements_raw_output_at(
    struct wally_tx *tx, uint32_t index, uint64_t satoshi,
    const unsigned char *script, size_t script_len,
    const unsigned char *asset, size_t asset_len,
    const unsigned char *value, size_t value_len,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *surjectionproof, size_t surjectionproof_len,
    const unsigned char *rangeproof, size_t rangeproof_len,
    uint32_t flags, bool is_elements)
{
    /* Add an output without allocating a temporary wally_tx_output */
    struct wally_tx_output output = {
        satoshi, (unsigned char *)script, script_len,
        is_elements ? WALLY_TX_IS_ELEMENTS : 0,
#ifdef BUILD_ELEMENTS
        (unsigned char *)asset, asset_len, (unsigned char *)value, value_len,
        (unsigned char *)nonce, nonce_len, (unsigned char *)surjectionproof, surjectionproof_len,
        (unsigned char *)rangeproof, rangeproof_len,
#endif /* BUILD_ELEMENTS */
    };
    int ret;

    if (flags)
        return WALLY_EINVAL;

    if (BYTES_INVALID_N(asset, asset_len, WALLY_TX_ASSET_CT_ASSET_LEN) ||
        ((value != NULL) != (value_len == WALLY_TX_ASSET_CT_VALUE_LEN ||
                             value_len == WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN)) ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_CT_NONCE_LEN) ||
        BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

    ret = wally_tx_add_output_at(tx, index, &output);
    wally_clear(&output, sizeof(output));
    return ret;
}